

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfsfileengine.cpp
# Opt level: O2

bool __thiscall QFSFileEnginePrivate::openFh(QFSFileEnginePrivate *this,OpenMode openMode,FILE *fh)

{
  QAbstractFileEngine *this_00;
  int iVar1;
  int *piVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (this->super_QAbstractFileEnginePrivate).q_ptr;
  this->fh = fh;
  this->fd = -1;
  bVar3 = true;
  if (((uint)openMode.super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
             super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i & 4) != 0) {
    do {
      iVar1 = fseeko64((FILE *)fh,0,2);
      if (iVar1 == 0) goto LAB_00228522;
      piVar2 = __errno_location();
      iVar1 = *piVar2;
    } while (iVar1 == 4);
    QSystemError::stdString((QString *)&QStack_48,iVar1);
    QAbstractFileEngine::setError(this_00,iVar1 == 0x18 ^ OpenError,(QString *)&QStack_48);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_48);
    (this->openMode).super_QFlagsStorageHelper<QIODeviceBase::OpenModeFlag,_4>.
    super_QFlagsStorage<QIODeviceBase::OpenModeFlag>.i = 0;
    this->fh = (FILE *)0x0;
    bVar3 = false;
  }
LAB_00228522:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return bVar3;
}

Assistant:

bool QFSFileEnginePrivate::openFh(QIODevice::OpenMode openMode, FILE *fh)
{
    Q_ASSERT_X(openMode & QIODevice::Unbuffered, "QFSFileEngine::open",
               "QFSFileEngine no longer supports buffered mode; upper layer must buffer");

    Q_Q(QFSFileEngine);
    this->fh = fh;
    fd = -1;

    // Seek to the end when in Append mode.
    if (openMode & QIODevice::Append) {
        int ret;
        do {
            ret = QT_FSEEK(fh, 0, SEEK_END);
        } while (ret != 0 && errno == EINTR);

        if (ret != 0) {
            q->setError(errno == EMFILE ? QFile::ResourceError : QFile::OpenError,
                        QSystemError::stdString(errno));

            this->openMode = QIODevice::NotOpen;
            this->fh = nullptr;

            return false;
        }
    }

    return true;
}